

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON * get_object_item(cJSON *object,char *name,cJSON_bool case_sensitive)

{
  int iVar1;
  bool bVar2;
  cJSON *local_30;
  cJSON *current_element;
  cJSON_bool case_sensitive_local;
  char *name_local;
  cJSON *object_local;
  
  if ((object == (cJSON *)0x0) || (name == (char *)0x0)) {
    object_local = (cJSON *)0x0;
  }
  else {
    local_30 = object->child;
    if (case_sensitive == 0) {
      while( true ) {
        bVar2 = false;
        if (local_30 != (cJSON *)0x0) {
          iVar1 = case_insensitive_strcmp((uchar *)name,(uchar *)local_30->string);
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        local_30 = local_30->next;
      }
    }
    else {
      while( true ) {
        bVar2 = false;
        if ((local_30 != (cJSON *)0x0) && (bVar2 = false, local_30->string != (char *)0x0)) {
          iVar1 = strcmp(name,local_30->string);
          bVar2 = iVar1 != 0;
        }
        if (!bVar2) break;
        local_30 = local_30->next;
      }
    }
    if ((local_30 == (cJSON *)0x0) || (local_30->string == (char *)0x0)) {
      object_local = (cJSON *)0x0;
    }
    else {
      object_local = local_30;
    }
  }
  return object_local;
}

Assistant:

static cJSON *get_object_item(const cJSON * const object, const char * const name, const cJSON_bool case_sensitive)
{
    cJSON *current_element = NULL;

    if ((object == NULL) || (name == NULL))
    {
        return NULL;
    }

    current_element = object->child;
    if (case_sensitive)
    {
        while ((current_element != NULL) && (current_element->string != NULL) && (strcmp(name, current_element->string) != 0))
        {
            current_element = current_element->next;
        }
    }
    else
    {
        while ((current_element != NULL) && (case_insensitive_strcmp((const unsigned char*)name, (const unsigned char*)(current_element->string)) != 0))
        {
            current_element = current_element->next;
        }
    }

    if ((current_element == NULL) || (current_element->string == NULL)) {
        return NULL;
    }

    return current_element;
}